

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O1

void Assimp::Write(JSONWriter *out,aiNode *ai,bool is_elem)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  stringstream *psVar2;
  ulong uVar3;
  long lVar4;
  string local_48;
  
  JSONWriter::StartObj(out,is_elem);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"name","");
  JSONWriter::Key(out,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  psVar2 = JSONWriter::LiteralToString(out,&out->buff,&ai->mName);
  local_48._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(psVar2 + 0x10),(char *)&local_48,1)
  ;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"transformation","");
  JSONWriter::Key(out,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  Write(out,&ai->mTransformation,false);
  if (ai->mNumMeshes != 0) {
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"meshes","");
    JSONWriter::Key(out,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    out->first = true;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out->field_0x58,"[\n",2);
    std::__cxx11::string::push_back((char)out + '\b');
    if (ai->mNumMeshes != 0) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        JSONWriter::Element<unsigned_int>(out,(uint *)((long)ai->mMeshes + lVar4));
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 4;
      } while (uVar3 < ai->mNumMeshes);
    }
    JSONWriter::EndArray(out);
  }
  if (ai->mNumChildren != 0) {
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"children","");
    JSONWriter::Key(out,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    out->first = true;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out->field_0x58,"[\n",2);
    std::__cxx11::string::push_back((char)out + '\b');
    if (ai->mNumChildren != 0) {
      uVar3 = 0;
      do {
        Write(out,ai->mChildren[uVar3],true);
        uVar3 = uVar3 + 1;
      } while (uVar3 < ai->mNumChildren);
    }
    JSONWriter::EndArray(out);
  }
  JSONWriter::EndObj(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiNode& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("name");
    out.SimpleValue(ai.mName);

    out.Key("transformation");
    Write(out, ai.mTransformation, false);

    if (ai.mNumMeshes) {
        out.Key("meshes");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumMeshes; ++n) {
            out.Element(ai.mMeshes[n]);
        }
        out.EndArray();
    }

    if (ai.mNumChildren) {
        out.Key("children");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumChildren; ++n) {
            Write(out, *ai.mChildren[n]);
        }
        out.EndArray();
    }

    out.EndObj();
}